

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O0

int Sdb_StoPrepareSet(Sdb_Sto_t *p,int iObj,int Index)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Sdb_Cut_t *pCut_00;
  word wVar3;
  Sdb_Cut_t *pCutTemp;
  int *pList;
  int *pCut;
  int v;
  int i;
  Vec_Int_t *vThis;
  int Index_local;
  int iObj_local;
  Sdb_Sto_t *p_local;
  
  p_00 = Vec_WecEntry(p->vCuts,iObj);
  piVar2 = Vec_IntArray(p_00);
  pList = piVar2 + 1;
  for (pCut._4_4_ = 0; pCut._4_4_ < *piVar2; pCut._4_4_ = pCut._4_4_ + 1) {
    pCut_00 = p->pCuts[Index] + pCut._4_4_;
    *(uint *)&pCut_00->field_0x14 = *(uint *)&pCut_00->field_0x14 & 0xfffffff | *pList << 0x1c;
    for (pCut._0_4_ = 1; (int)pCut <= *pList; pCut._0_4_ = (int)pCut + 1) {
      pCut_00->pLeaves[(int)pCut + -1] = pList[(int)pCut];
    }
    pCut_00->iFunc = pList[*pList + 1];
    wVar3 = Sdb_CutGetSign(pCut_00);
    pCut_00->Sign = wVar3;
    uVar1 = Sdb_CutTreeLeaves(p,pCut_00);
    *(uint *)&pCut_00->field_0x14 = *(uint *)&pCut_00->field_0x14 & 0xf0000000 | uVar1 & 0xfffffff;
    pList = pList + (*pList + 2);
  }
  return *piVar2;
}

Assistant:

static inline int Sdb_StoPrepareSet( Sdb_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sdb_ForEachCut( pList, pCut, i )
    {
        Sdb_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sdb_CutGetSign( pCutTemp );
        pCutTemp->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutTemp );
    }
    return pList[0];
}